

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O2

UnicodeSet * __thiscall
icu_63::RegexCompile::createSetForProperty(RegexCompile *this,UnicodeString *propName,UBool negated)

{
  short sVar1;
  LocalPointer<icu_63::UnicodeSet> LVar2;
  int8_t iVar3;
  UBool UVar4;
  int iVar5;
  int32_t iVar6;
  UnicodeSet *pUVar7;
  LocalPointerBase<icu_63::UnicodeSet> LVar8;
  UChar32 end;
  UChar32 start;
  ConstChar16Ptr *pCVar9;
  uint options;
  UErrorCode status;
  LocalPointer<icu_63::UnicodeSet> set;
  char local_414;
  ConstChar16Ptr local_410;
  ConstChar16Ptr local_408;
  ConstChar16Ptr local_400;
  ConstChar16Ptr local_3f8;
  ConstChar16Ptr local_3f0;
  ConstChar16Ptr local_3e8;
  ConstChar16Ptr local_3e0;
  ConstChar16Ptr local_3d8;
  ConstChar16Ptr local_3d0;
  ConstChar16Ptr local_3c8;
  ConstChar16Ptr local_3c0;
  ConstChar16Ptr local_3b8;
  ConstChar16Ptr local_3b0;
  ConstChar16Ptr local_3a8;
  ConstChar16Ptr local_3a0;
  ConstChar16Ptr local_398;
  ConstChar16Ptr local_390;
  ConstChar16Ptr local_388;
  ConstChar16Ptr local_380;
  ConstChar16Ptr local_378;
  ConstChar16Ptr local_370;
  ConstChar16Ptr local_368;
  ConstChar16Ptr local_360;
  ConstChar16Ptr local_358;
  ConstChar16Ptr local_350;
  ConstChar16Ptr local_348;
  ConstChar16Ptr local_340;
  ConstChar16Ptr local_338;
  ConstChar16Ptr local_330;
  char16_t *local_328;
  char16_t *local_318;
  char16_t *local_308;
  char16_t *local_2f8;
  char16_t *local_2e8;
  char16_t *local_2d8;
  char16_t *local_2c8;
  char16_t *local_2b8;
  char16_t *local_2a8;
  char16_t *local_298;
  char16_t *local_288;
  char16_t *local_278;
  char16_t *local_268;
  char16_t *local_258;
  char16_t *local_248;
  char16_t *local_238;
  char16_t *local_228;
  char16_t *local_218;
  char16_t *local_208;
  char16_t *local_1f8;
  char16_t *local_1f0;
  char16_t *local_1e0;
  char16_t *local_1d0;
  char16_t *local_1c0;
  char16_t *local_1b0;
  char16_t *local_1a0;
  char16_t *local_198;
  char16_t *local_188;
  char16_t *local_178;
  char16_t *local_168;
  char16_t *local_158;
  UnicodeString mPropName;
  UnicodeString setExpr;
  UnicodeString blockName;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return (UnicodeSet *)0x0;
  }
  set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr =
       (LocalPointerBase<icu_63::UnicodeSet>)(UnicodeSet *)0x0;
  status = U_ZERO_ERROR;
  setExpr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  setExpr.fUnion.fStackFields.fLengthAndFlags = 2;
  local_330.p_ = L"[\\p{";
  icu_63::UnicodeString::append(&setExpr,&local_330,-1);
  local_158 = local_330.p_;
  icu_63::UnicodeString::append(&setExpr,propName);
  pCVar9 = &local_338;
  local_338.p_ = L"}]";
  icu_63::UnicodeString::append(&setExpr,pCVar9,-1);
  local_168 = local_338.p_;
  options = this->fModeFlags & 2;
  pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar9);
  if (pUVar7 != (UnicodeSet *)0x0) {
    UnicodeSet::UnicodeSet(pUVar7,&setExpr,options,(SymbolTable *)0x0,&status);
  }
  LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode(&set,pUVar7,&status);
  local_414 = negated;
  if (status == U_MEMORY_ALLOCATION_ERROR || status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0026a1bc;
  status = U_ZERO_ERROR;
  pCVar9 = &local_340;
  local_340.p_ = L"word";
  iVar3 = icu_63::UnicodeString::caseCompare(propName,pCVar9,-1,0);
  local_178 = local_340.p_;
  if (iVar3 == '\0') {
    pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar9);
    if (pUVar7 != (UnicodeSet *)0x0) {
      UnicodeSet::UnicodeSet(pUVar7,this->fRXPat->fStaticSets[1]);
    }
  }
  else {
    pCVar9 = &local_348;
    local_348.p_ = L"all";
    iVar3 = icu_63::UnicodeString::compare(propName,pCVar9,-1);
    local_188 = local_348.p_;
    if (iVar3 != '\0') {
      icu_63::UnicodeString::UnicodeString(&mPropName,propName);
      pCVar9 = &local_408;
      local_408.p_ = L"In";
      UVar4 = icu_63::UnicodeString::startsWith(&mPropName,pCVar9,2);
      if (UVar4 == '\0') {
        local_1a0 = local_408.p_;
LAB_00269c96:
        local_410.p_ = L"Is";
        UVar4 = icu_63::UnicodeString::startsWith(propName,&local_410,2);
        if (UVar4 == '\0') {
          local_1f8 = local_410.p_;
LAB_00269db1:
          pCVar9 = &local_370;
          local_370.p_ = L"java";
          UVar4 = icu_63::UnicodeString::startsWith(propName,pCVar9,-1);
          local_208 = local_370.p_;
          if (UVar4 != '\0') {
            status = U_ZERO_ERROR;
            pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar9);
            if (pUVar7 != (UnicodeSet *)0x0) {
              UnicodeSet::UnicodeSet(pUVar7);
            }
            LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode(&set,pUVar7,&status);
            if (U_ZERO_ERROR < status) goto LAB_0026a1af;
            local_378.p_ = L"javaDefined";
            iVar3 = icu_63::UnicodeString::compare(propName,&local_378,-1);
            local_218 = local_378.p_;
            if (iVar3 == '\0') {
              addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,1,&status
                         );
              UnicodeSet::complement
                        ((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr);
            }
            else {
              local_380.p_ = L"javaDigit";
              iVar3 = icu_63::UnicodeString::compare(propName,&local_380,-1);
              local_228 = local_380.p_;
              iVar6 = 0x200;
              if (iVar3 == '\0') {
LAB_0026a45c:
                addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,iVar6,
                            &status);
              }
              else {
                local_388.p_ = L"javaIdentifierIgnorable";
                iVar3 = icu_63::UnicodeString::compare(propName,&local_388,-1);
                local_238 = local_388.p_;
                if (iVar3 != '\0') {
                  local_390.p_ = L"javaISOControl";
                  iVar3 = icu_63::UnicodeString::compare(propName,&local_390,-1);
                  local_248 = local_390.p_;
                  if (iVar3 == '\0') {
                    LVar8.ptr = UnicodeSet::add(set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,0
                                                ,0x1f);
                    end = 0x9f;
                    start = 0x7f;
LAB_0026a35b:
                    UnicodeSet::add(LVar8.ptr,start,end);
                    goto LAB_0026a46e;
                  }
                  local_398.p_ = L"javaJavaIdentifierPart";
                  iVar3 = icu_63::UnicodeString::compare(propName,&local_398,-1);
                  local_258 = local_398.p_;
                  if (iVar3 != '\0') {
                    local_3a0.p_ = L"javaJavaIdentifierStart";
                    iVar3 = icu_63::UnicodeString::compare(propName,&local_3a0,-1);
                    local_268 = local_3a0.p_;
                    if (iVar3 == '\0') {
                      addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                  0x3e,&status);
                      addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                  0x400,&status);
                      iVar6 = 0x400000;
                      addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                  0x2000000,&status);
                    }
                    else {
                      local_3a8.p_ = L"javaLetter";
                      iVar3 = icu_63::UnicodeString::compare(propName,&local_3a8,-1);
                      local_278 = local_3a8.p_;
                      if (iVar3 == '\0') {
                        iVar6 = 0x3e;
                      }
                      else {
                        local_3b0.p_ = L"javaLetterOrDigit";
                        iVar3 = icu_63::UnicodeString::compare(propName,&local_3b0,-1);
                        local_288 = local_3b0.p_;
                        if (iVar3 == '\0') {
                          addCategory((UnicodeSet *)
                                      set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,0x3e,
                                      &status);
                        }
                        else {
                          local_3b8.p_ = L"javaLowerCase";
                          iVar3 = icu_63::UnicodeString::compare(propName,&local_3b8,-1);
                          local_298 = local_3b8.p_;
                          if (iVar3 == '\0') {
                            iVar6 = 4;
                          }
                          else {
                            local_3c0.p_ = L"javaMirrored";
                            iVar3 = icu_63::UnicodeString::compare(propName,&local_3c0,-1);
                            local_2a8 = local_3c0.p_;
                            if (iVar3 == '\0') {
                              UnicodeSet::applyIntPropertyValue
                                        ((UnicodeSet *)
                                         set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                         UCHAR_BIDI_MIRRORED,1,&status);
                              goto LAB_0026a46e;
                            }
                            local_3c8.p_ = L"javaSpaceChar";
                            iVar3 = icu_63::UnicodeString::compare(propName,&local_3c8,-1);
                            local_2b8 = local_3c8.p_;
                            if (iVar3 == '\0') {
                              iVar6 = 0x7000;
                            }
                            else {
                              local_3d0.p_ = L"javaSupplementaryCodePoint";
                              iVar3 = icu_63::UnicodeString::compare(propName,&local_3d0,-1);
                              local_2c8 = local_3d0.p_;
                              if (iVar3 == '\0') {
                                start = 0x10000;
LAB_0026a4d1:
                                end = 0x10ffff;
                                LVar8 = set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr;
                                goto LAB_0026a35b;
                              }
                              local_3d8.p_ = L"javaTitleCase";
                              iVar3 = icu_63::UnicodeString::compare(propName,&local_3d8,-1);
                              local_2d8 = local_3d8.p_;
                              if (iVar3 == '\0') {
                                iVar6 = 8;
                              }
                              else {
                                local_3e0.p_ = L"javaUnicodeIdentifierStart";
                                iVar3 = icu_63::UnicodeString::compare(propName,&local_3e0,-1);
                                local_2e8 = local_3e0.p_;
                                if (iVar3 == '\0') {
                                  iVar6 = 0x400;
                                  addCategory((UnicodeSet *)
                                              set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                              0x3e,&status);
                                }
                                else {
                                  local_3e8.p_ = L"javaUnicodeIdentifierPart";
                                  iVar3 = icu_63::UnicodeString::compare(propName,&local_3e8,-1);
                                  local_2f8 = local_3e8.p_;
                                  if (iVar3 == '\0') {
                                    addCategory((UnicodeSet *)
                                                set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                                0x3e,&status);
                                    addCategory((UnicodeSet *)
                                                set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                                0x400000,&status);
                                    addCategory((UnicodeSet *)
                                                set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                                0x200,&status);
                                    addCategory((UnicodeSet *)
                                                set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                                0x400,&status);
                                    addCategory((UnicodeSet *)
                                                set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                                                0x100,&status);
                                    goto LAB_0026a3db;
                                  }
                                  local_3f0.p_ = L"javaUpperCase";
                                  iVar3 = icu_63::UnicodeString::compare(propName,&local_3f0,-1);
                                  local_308 = local_3f0.p_;
                                  iVar6 = 2;
                                  if (iVar3 != '\0') {
                                    local_3f8.p_ = L"javaValidCodePoint";
                                    iVar3 = icu_63::UnicodeString::compare(propName,&local_3f8,-1);
                                    local_318 = local_3f8.p_;
                                    if (iVar3 != '\0') {
                                      local_400.p_ = L"javaWhitespace";
                                      iVar3 = icu_63::UnicodeString::compare(propName,&local_400,-1)
                                      ;
                                      local_328 = local_400.p_;
                                      if (iVar3 != '\0') goto LAB_0026a1a7;
                                      addCategory((UnicodeSet *)
                                                  set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr
                                                  ,0x7000,&status);
                                      LVar2 = set;
                                      UnicodeSet::UnicodeSet((UnicodeSet *)&blockName);
                                      pUVar7 = UnicodeSet::add((UnicodeSet *)&blockName,0xa0);
                                      pUVar7 = UnicodeSet::add(pUVar7,0x2007);
                                      pUVar7 = UnicodeSet::add(pUVar7,0x202f);
                                      UnicodeSet::removeAll
                                                ((UnicodeSet *)
                                                 LVar2.super_LocalPointerBase<icu_63::UnicodeSet>.
                                                 ptr,pUVar7);
                                      UnicodeSet::~UnicodeSet((UnicodeSet *)&blockName);
                                      LVar8.ptr = UnicodeSet::add(set.
                                                  super_LocalPointerBase<icu_63::UnicodeSet>.ptr,9,
                                                  0xd);
                                      end = 0x1f;
                                      start = 0x1c;
                                      goto LAB_0026a35b;
                                    }
                                    start = 0;
                                    goto LAB_0026a4d1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0026a45c;
                  }
                  addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,0x3e,
                              &status);
                  addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                              0x2000000,&status);
                  addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,
                              0x400000,&status);
                  addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,0x200
                              ,&status);
                  addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,0x400
                              ,&status);
                  addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,0x100
                              ,&status);
LAB_0026a3db:
                  addCategory((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,0x40,
                              &status);
                }
                addIdentifierIgnorable
                          ((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,&status)
                ;
              }
            }
LAB_0026a46e:
            if ((status < U_ILLEGAL_ARGUMENT_ERROR) &&
               (UVar4 = UnicodeSet::isEmpty((UnicodeSet *)
                                            set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr),
               UVar4 == '\0' && options != 0)) {
              UnicodeSet::closeOver
                        ((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,2);
            }
            goto LAB_0026a1af;
          }
        }
        else {
          sVar1 = (propName->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (propName->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          local_1b0 = local_410.p_;
          if (iVar5 < 3) goto LAB_00269db1;
          icu_63::UnicodeString::remove(&mPropName,(char *)0x0);
          iVar6 = icu_63::UnicodeString::indexOf(&mPropName,L'=');
          if (iVar6 < 0) {
            local_350.p_ = L"assigned";
            iVar3 = icu_63::UnicodeString::caseCompare(&mPropName,&local_350,-1,0);
            local_1c0 = local_350.p_;
            if (iVar3 == '\0') {
              icu_63::UnicodeString::setTo(&mPropName,L"unassigned",-1);
              negated = negated == '\0';
            }
            else {
              local_358.p_ = L"TitleCase";
              iVar3 = icu_63::UnicodeString::caseCompare(&mPropName,&local_358,-1,0);
              local_1d0 = local_358.p_;
              if (iVar3 == '\0') {
                icu_63::UnicodeString::setTo(&mPropName,L"Titlecase_Letter",-1);
              }
            }
            local_360.p_ = L"[\\p{";
            icu_63::UnicodeString::insert(&mPropName,0,&local_360,-1);
            local_1e0 = local_360.p_;
            pCVar9 = &local_368;
            local_368.p_ = L"}]";
            icu_63::UnicodeString::append(&mPropName,pCVar9,-1);
            local_1f0 = local_368.p_;
            pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar9);
            if (pUVar7 != (UnicodeSet *)0x0) {
              UnicodeSet::UnicodeSet(pUVar7,&mPropName,this->fStatus);
            }
            LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode(&set,pUVar7,&status);
            local_414 = negated;
            if ((status < U_ILLEGAL_ARGUMENT_ERROR) &&
               (UVar4 = UnicodeSet::isEmpty((UnicodeSet *)
                                            set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr),
               UVar4 == '\0' && options != 0)) {
              UnicodeSet::closeOver
                        ((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,2);
            }
            goto LAB_0026a1af;
          }
        }
LAB_0026a1a7:
        status = U_REGEX_PROPERTY_SYNTAX;
      }
      else {
        if (-1 < mPropName.fUnion.fStackFields.fLengthAndFlags) {
          mPropName.fUnion.fFields.fLength = (int)mPropName.fUnion.fStackFields.fLengthAndFlags >> 5
          ;
        }
        local_198 = local_408.p_;
        if (mPropName.fUnion.fFields.fLength < 3) goto LAB_00269c96;
        status = U_ZERO_ERROR;
        pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar9);
        if (pUVar7 != (UnicodeSet *)0x0) {
          UnicodeSet::UnicodeSet(pUVar7);
        }
        LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode(&set,pUVar7,&status);
        if (status < U_ILLEGAL_ARGUMENT_ERROR) {
          icu_63::UnicodeString::UnicodeString(&blockName,&mPropName,2);
          LVar2 = set;
          icu_63::UnicodeString::UnicodeString(&local_70,L"Block");
          UnicodeSet::applyPropertyAlias
                    ((UnicodeSet *)LVar2.super_LocalPointerBase<icu_63::UnicodeSet>.ptr,&local_70,
                     &blockName,&status);
          icu_63::UnicodeString::~UnicodeString(&local_70);
          icu_63::UnicodeString::~UnicodeString(&blockName);
        }
      }
LAB_0026a1af:
      icu_63::UnicodeString::~UnicodeString(&mPropName);
      goto LAB_0026a1bc;
    }
    pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar9);
    if (pUVar7 != (UnicodeSet *)0x0) {
      UnicodeSet::UnicodeSet(pUVar7,0,0x10ffff);
    }
  }
  LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode(&set,pUVar7,&status);
LAB_0026a1bc:
  icu_63::UnicodeString::~UnicodeString(&setExpr);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (local_414 != '\0') {
      UnicodeSet::complement((UnicodeSet *)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr);
    }
    LVar8 = set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr;
    set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr =
         (LocalPointerBase<icu_63::UnicodeSet>)(UnicodeSet *)0x0;
  }
  else {
    if (status == U_ILLEGAL_ARGUMENT_ERROR) {
      status = U_REGEX_PROPERTY_SYNTAX;
    }
    error(this,status);
    LVar8.ptr = (UnicodeSet *)0x0;
  }
  LocalPointer<icu_63::UnicodeSet>::~LocalPointer(&set);
  return LVar8.ptr;
}

Assistant:

UnicodeSet *RegexCompile::createSetForProperty(const UnicodeString &propName, UBool negated) {

    if (U_FAILURE(*fStatus)) {
        return nullptr;
    }
    LocalPointer<UnicodeSet> set;
    UErrorCode status = U_ZERO_ERROR;

    do {      // non-loop, exists to allow breaks from the block.
        //
        //  First try the property as we received it
        //
        UnicodeString   setExpr;
        uint32_t        usetFlags = 0;
        setExpr.append(u"[\\p{", -1);
        setExpr.append(propName);
        setExpr.append(u"}]", -1);
        if (fModeFlags & UREGEX_CASE_INSENSITIVE) {
            usetFlags |= USET_CASE_INSENSITIVE;
        }
        set.adoptInsteadAndCheckErrorCode(new UnicodeSet(setExpr, usetFlags, NULL, status), status);
        if (U_SUCCESS(status) || status == U_MEMORY_ALLOCATION_ERROR) {
            break;
        }

        //
        //  The incoming property wasn't directly recognized by ICU.

        //  Check [:word:] and [:all:]. These are not recognized as a properties by ICU UnicodeSet.
        //     Java accepts 'word' with mixed case.
        //     Java accepts 'all' only in all lower case.

        status = U_ZERO_ERROR;
        if (propName.caseCompare(u"word", -1, 0) == 0) {
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(*(fRXPat->fStaticSets[URX_ISWORD_SET])), status);
            break;
        }
        if (propName.compare(u"all", -1) == 0) {
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(0, 0x10ffff), status);
            break;
        }


        //    Do Java InBlock expressions
        //
        UnicodeString mPropName = propName;
        if (mPropName.startsWith(u"In", 2) && mPropName.length() >= 3) {
            status = U_ZERO_ERROR;
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(), status);
            if (U_FAILURE(status)) {
                break;
            }
            UnicodeString blockName(mPropName, 2);  // Property with the leading "In" removed.
            set->applyPropertyAlias(UnicodeString(u"Block"), blockName, status);
            break;
        }

        //  Check for the Java form "IsBooleanPropertyValue", which we will recast
        //  as "BooleanPropertyValue". The property value can be either a
        //  a General Category or a Script Name.

        if (propName.startsWith(u"Is", 2) && propName.length()>=3) {
            mPropName.remove(0, 2);      // Strip the "Is"
            if (mPropName.indexOf(u'=') >= 0) {
                // Reject any "Is..." property expression containing an '=', that is,
                // any non-binary property expression.
                status = U_REGEX_PROPERTY_SYNTAX;
                break;
            }

            if (mPropName.caseCompare(u"assigned", -1, 0) == 0) {
                mPropName.setTo(u"unassigned", -1);
                negated = !negated;
            } else if (mPropName.caseCompare(u"TitleCase", -1, 0) == 0) {
                mPropName.setTo(u"Titlecase_Letter", -1);
            }

            mPropName.insert(0, u"[\\p{", -1);
            mPropName.append(u"}]", -1);
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(mPropName, *fStatus), status);

            if (U_SUCCESS(status) && !set->isEmpty() && (usetFlags & USET_CASE_INSENSITIVE)) {
                set->closeOver(USET_CASE_INSENSITIVE);
            }
            break;

        }

        if (propName.startsWith(u"java", -1)) {
            status = U_ZERO_ERROR;
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(), status);
            if (U_FAILURE(status)) {
                break;
            }
            //
            //  Try the various Java specific properties.
            //   These all begin with "java"
            //
            if (propName.compare(u"javaDefined", -1) == 0) {
                addCategory(set.getAlias(), U_GC_CN_MASK, status);
                set->complement();
            }
            else if (propName.compare(u"javaDigit", -1) == 0) {
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
            }
            else if (propName.compare(u"javaIdentifierIgnorable", -1) == 0) {
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaISOControl", -1) == 0) {
                set->add(0, 0x1F).add(0x7F, 0x9F);
            }
            else if (propName.compare(u"javaJavaIdentifierPart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_SC_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_MC_MASK, status);
                addCategory(set.getAlias(), U_GC_MN_MASK, status);
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaJavaIdentifierStart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_SC_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
            }
            else if (propName.compare(u"javaLetter", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
            }
            else if (propName.compare(u"javaLetterOrDigit", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
            }
            else if (propName.compare(u"javaLowerCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LL_MASK, status);
            }
            else if (propName.compare(u"javaMirrored", -1) == 0) {
                set->applyIntPropertyValue(UCHAR_BIDI_MIRRORED, 1, status);
            }
            else if (propName.compare(u"javaSpaceChar", -1) == 0) {
                addCategory(set.getAlias(), U_GC_Z_MASK, status);
            }
            else if (propName.compare(u"javaSupplementaryCodePoint", -1) == 0) {
                set->add(0x10000, UnicodeSet::MAX_VALUE);
            }
            else if (propName.compare(u"javaTitleCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LT_MASK, status);
            }
            else if (propName.compare(u"javaUnicodeIdentifierStart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
            }
            else if (propName.compare(u"javaUnicodeIdentifierPart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_MC_MASK, status);
                addCategory(set.getAlias(), U_GC_MN_MASK, status);
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaUpperCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LU_MASK, status);
            }
            else if (propName.compare(u"javaValidCodePoint", -1) == 0) {
                set->add(0, UnicodeSet::MAX_VALUE);
            }
            else if (propName.compare(u"javaWhitespace", -1) == 0) {
                addCategory(set.getAlias(), U_GC_Z_MASK, status);
                set->removeAll(UnicodeSet().add(0xa0).add(0x2007).add(0x202f));
                set->add(9, 0x0d).add(0x1c, 0x1f);
            } else {
                status = U_REGEX_PROPERTY_SYNTAX;
            }

            if (U_SUCCESS(status) && !set->isEmpty() && (usetFlags & USET_CASE_INSENSITIVE)) {
                set->closeOver(USET_CASE_INSENSITIVE);
            }
            break;
        }

        // Unrecognized property. ICU didn't like it as it was, and none of the Java compatibility
        // extensions matched it.
        status = U_REGEX_PROPERTY_SYNTAX;
    } while (false);   // End of do loop block. Code above breaks out of the block on success or hard failure.

    if (U_SUCCESS(status)) {
        U_ASSERT(set.isValid());
        if (negated) {
            set->complement();
        }
        return set.orphan();
    } else {
        if (status == U_ILLEGAL_ARGUMENT_ERROR) {
            status = U_REGEX_PROPERTY_SYNTAX;
        }
        error(status);
        return nullptr;
    }
}